

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O1

int x509_name_ex_new(ASN1_VALUE **val,ASN1_ITEM *it)

{
  ASN1_VALUE *orig_ptr;
  OPENSSL_STACK *pOVar1;
  BUF_MEM *pBVar2;
  
  orig_ptr = (ASN1_VALUE *)OPENSSL_malloc(0x28);
  if (orig_ptr != (ASN1_VALUE *)0x0) {
    pOVar1 = OPENSSL_sk_new_null();
    *(OPENSSL_STACK **)orig_ptr = pOVar1;
    if (pOVar1 != (OPENSSL_STACK *)0x0) {
      pBVar2 = BUF_MEM_new();
      *(BUF_MEM **)(orig_ptr + 0x10) = pBVar2;
      if (pBVar2 != (BUF_MEM *)0x0) {
        *(undefined8 *)(orig_ptr + 0x18) = 0;
        *(undefined4 *)(orig_ptr + 0x20) = 0;
        *(undefined4 *)(orig_ptr + 8) = 1;
        *val = orig_ptr;
        return 1;
      }
    }
    if (*(OPENSSL_STACK **)orig_ptr != (OPENSSL_STACK *)0x0) {
      OPENSSL_sk_free(*(OPENSSL_STACK **)orig_ptr);
    }
    OPENSSL_free(orig_ptr);
  }
  return 0;
}

Assistant:

static int x509_name_ex_new(ASN1_VALUE **val, const ASN1_ITEM *it) {
  X509_NAME *ret = NULL;
  ret = reinterpret_cast<X509_NAME *>(OPENSSL_malloc(sizeof(X509_NAME)));
  if (!ret) {
    goto memerr;
  }
  if ((ret->entries = sk_X509_NAME_ENTRY_new_null()) == NULL) {
    goto memerr;
  }
  if ((ret->bytes = BUF_MEM_new()) == NULL) {
    goto memerr;
  }
  ret->canon_enc = NULL;
  ret->canon_enclen = 0;
  ret->modified = 1;
  *val = (ASN1_VALUE *)ret;
  return 1;

memerr:
  if (ret) {
    if (ret->entries) {
      sk_X509_NAME_ENTRY_free(ret->entries);
    }
    OPENSSL_free(ret);
  }
  return 0;
}